

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O2

void __thiscall
OpenMD::EAMAdapter::makeFuncfl
          (EAMAdapter *this,RealType latticeConstant,string *latticeType,int nrho,RealType drho,
          int nr,RealType dr,RealType rcut,vector<double,_std::allocator<double>_> *Z,
          vector<double,_std::allocator<double>_> *rho,vector<double,_std::allocator<double>_> *F)

{
  AtomType *pAVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  RealType local_118;
  RealType local_110;
  FuncflParameters local_108;
  shared_ptr<OpenMD::GenericData> local_88;
  shared_ptr<OpenMD::GenericData> local_78;
  undefined4 local_60;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48 [16];
  RealType local_38;
  
  local_138.field_2._M_allocated_capacity = (size_type)drho;
  local_138.field_2._8_8_ = dr;
  local_118 = rcut;
  local_110 = latticeConstant;
  bVar2 = isEAM(this);
  if (bVar2) {
    AtomType::removeProperty(this->at_,(string *)EAMtypeID_abi_cxx11_);
    AtomType::removeProperty(this->at_,(string *)FuncflTypeID_abi_cxx11_);
  }
  local_58 = local_48;
  local_50 = 0;
  local_108.atomicNumber = 0;
  local_108.atomicMass = 0.0;
  local_108.nrho = 0;
  local_48[0] = 0;
  local_108.drho = 0.0;
  local_108.nr = 0;
  local_108.dr = 0.0;
  local_108.rcut = 0.0;
  local_108.Z.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_108.Z.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_108.Z.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_108.rho.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_108.rho.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_108.rho.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_108.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_108.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_108.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_60 = 0;
  local_38 = local_110;
  std::__cxx11::string::_M_assign((string *)&local_58);
  local_108.drho = (RealType)local_138.field_2._M_allocated_capacity;
  local_108.dr = (RealType)local_138.field_2._8_8_;
  local_108.rcut = local_118;
  local_108.nrho = nrho;
  local_108.nr = nr;
  std::vector<double,_std::allocator<double>_>::operator=(&local_108.Z,Z);
  std::vector<double,_std::allocator<double>_>::operator=(&local_108.rho,rho);
  std::vector<double,_std::allocator<double>_>::operator=(&local_108.F,F);
  pAVar1 = this->at_;
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::EAMParameters>,std::__cxx11::string_const&,OpenMD::EAMParameters&>
            (&local_138,(EAMParameters *)EAMtypeID_abi_cxx11_);
  local_78.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_138._M_dataplus._M_p;
  local_78.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length;
  local_138._M_dataplus._M_p = (pointer)0x0;
  local_138._M_string_length = 0;
  AtomType::addProperty(pAVar1,&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_138._M_string_length);
  pAVar1 = this->at_;
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::FuncflParameters>,std::__cxx11::string_const&,OpenMD::FuncflParameters&>
            (&local_138,(FuncflParameters *)FuncflTypeID_abi_cxx11_);
  local_88.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_138._M_dataplus._M_p;
  local_88.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length;
  local_138._M_dataplus._M_p = (pointer)0x0;
  local_138._M_string_length = 0;
  AtomType::addProperty(pAVar1,&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_138._M_string_length);
  FuncflParameters::~FuncflParameters(&local_108);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void EAMAdapter::makeFuncfl(RealType latticeConstant, std::string latticeType,
                              int nrho, RealType drho, int nr, RealType dr,
                              RealType rcut, vector<RealType> Z,
                              vector<RealType> rho, vector<RealType> F) {
    if (isEAM()) {
      at_->removeProperty(EAMtypeID);
      at_->removeProperty(FuncflTypeID);
    }

    EAMParameters eamParam {};
    FuncflParameters funcflParam {};

    eamParam.eamType         = eamFuncfl;
    eamParam.latticeConstant = latticeConstant;
    eamParam.latticeType     = latticeType;

    funcflParam.nrho = nrho;
    funcflParam.drho = drho;
    funcflParam.nr   = nr;
    funcflParam.dr   = dr;
    funcflParam.rcut = rcut;
    funcflParam.Z    = Z;
    funcflParam.rho  = rho;
    funcflParam.F    = F;

    at_->addProperty(std::make_shared<EAMData>(EAMtypeID, eamParam));
    at_->addProperty(std::make_shared<FuncflData>(FuncflTypeID, funcflParam));
  }